

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# possible-contents.cpp
# Opt level: O0

void __thiscall
PossibleContentsTest_TestOracleManyTypes_Test::TestBody
          (PossibleContentsTest_TestOracleManyTypes_Test *this)

{
  Location location;
  bool bVar1;
  type wasm_00;
  pointer pMVar2;
  char *pcVar3;
  char *in_R9;
  ConeType CVar4;
  Name NVar5;
  AssertHelper local_1c8;
  Message local_1c0;
  uint local_1b4;
  uintptr_t local_1b0;
  Index local_1a8;
  uintptr_t local_1a0;
  Index local_198 [2];
  undefined1 local_190 [8];
  AssertionResult gtest_ar_1;
  Message local_178;
  BasicHeapType local_16c;
  Type local_168;
  HeapType local_160;
  undefined1 local_158 [8];
  AssertionResult gtest_ar;
  string local_140;
  AssertHelper local_120;
  Message local_118;
  bool local_109;
  undefined1 local_108 [8];
  AssertionResult gtest_ar_;
  ResultLocation local_e8;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined1 local_b8 [8];
  PossibleContents bodyContents;
  ContentOracle oracle;
  allocator<char> local_39;
  string local_38 [32];
  undefined1 local_18 [8];
  unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_> wasm;
  PossibleContentsTest_TestOracleManyTypes_Test *this_local;
  
  wasm._M_t.super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
  super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl =
       (__uniq_ptr_data<wasm::Module,_std::default_delete<wasm::Module>,_true,_true>)
       (__uniq_ptr_data<wasm::Module,_std::default_delete<wasm::Module>,_true,_true>)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_38,
             "\n    (module\n      (type $A (sub (struct (field i32))))\n      (type $B (sub (struct (field i64))))\n      (type $C (sub (struct (field f32))))\n      (type $D (sub (struct (field f64))))\n      (func $foo (result (ref any))\n        (select (result (ref any))\n          (select (result (ref any))\n            (struct.new_default $A)\n            (struct.new_default $B)\n            (i32.const 0)\n          )\n          (select (result (ref any))\n            (struct.new_default $C)\n            (struct.new_default $D)\n            (i32.const 0)\n          )\n          (i32.const 0)\n        )\n      )\n    )\n  "
             ,&local_39);
  parse((string *)local_18);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  wasm_00 = std::unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_>::operator*
                      ((unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_> *)local_18);
  ::wasm::ContentOracle::ContentOracle
            ((ContentOracle *)
             ((long)&bodyContents.value.
                     super__Variant_base<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     .
                     super__Move_assign_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     .
                     super__Copy_assign_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     .
                     super__Move_ctor_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     .
                     super__Copy_ctor_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
             + 0x18),wasm_00,&options);
  pMVar2 = std::unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_>::operator->
                     ((unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_> *)local_18);
  ::wasm::Name::Name((Name *)&gtest_ar_.message_,"foo");
  NVar5.super_IString.str._M_str =
       (char *)gtest_ar_.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl;
  NVar5.super_IString.str._M_len = (size_t)pMVar2;
  local_e8.func = (Function *)::wasm::Module::getFunction(NVar5);
  local_e8.index = 0;
  std::
  variant<wasm::ExpressionLocation,wasm::ParamLocation,wasm::LocalLocation,wasm::ResultLocation,wasm::GlobalLocation,wasm::SignatureParamLocation,wasm::SignatureResultLocation,wasm::DataLocation,wasm::TagLocation,wasm::CaughtExnRefLocation,wasm::NullLocation,wasm::ConeReadLocation>
  ::variant<wasm::ResultLocation,void,void,wasm::ResultLocation,void>
            ((variant<wasm::ExpressionLocation,wasm::ParamLocation,wasm::LocalLocation,wasm::ResultLocation,wasm::GlobalLocation,wasm::SignatureParamLocation,wasm::SignatureResultLocation,wasm::DataLocation,wasm::TagLocation,wasm::CaughtExnRefLocation,wasm::NullLocation,wasm::ConeReadLocation>
              *)&local_d8,&local_e8);
  location.
  super__Variant_base<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  .
  super__Move_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  .
  super__Copy_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  .
  super__Move_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  .
  super__Copy_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  .
  super__Variant_storage_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  ._M_u._8_8_ = uStack_d0;
  location.
  super__Variant_base<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  .
  super__Move_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  .
  super__Copy_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  .
  super__Move_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  .
  super__Copy_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  .
  super__Variant_storage_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  ._M_u._M_first._M_storage.expr = (Expression *)local_d8;
  location.
  super__Variant_base<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  .
  super__Move_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  .
  super__Copy_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  .
  super__Move_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  .
  super__Copy_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  .
  super__Variant_storage_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  ._M_u._16_8_ = local_c8;
  location.
  super__Variant_base<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  .
  super__Move_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  .
  super__Copy_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  .
  super__Move_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  .
  super__Copy_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  .
  super__Variant_storage_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  ._24_8_ = uStack_c0;
  ::wasm::ContentOracle::getContents
            ((PossibleContents *)local_b8,
             (ContentOracle *)
             ((long)&bodyContents.value.
                     super__Variant_base<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     .
                     super__Move_assign_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     .
                     super__Copy_assign_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     .
                     super__Move_ctor_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     .
                     super__Copy_ctor_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
             + 0x18),location);
  local_109 = ::wasm::PossibleContents::isConeType((PossibleContents *)local_b8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_108,&local_109,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
  if (!bVar1) {
    testing::Message::Message(&local_118);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_140,(internal *)local_108,(AssertionResult *)"bodyContents.isConeType()",
               "false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/possible-contents.cpp"
               ,0x398,pcVar3);
    testing::internal::AssertHelper::operator=(&local_120,&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    std::__cxx11::string::~string((string *)&local_140);
    testing::Message::~Message(&local_118);
  }
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
  if (gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    local_168 = ::wasm::PossibleContents::getType((PossibleContents *)local_b8);
    local_160 = ::wasm::Type::getHeapType(&local_168);
    local_16c = struct_;
    testing::internal::EqHelper::Compare<wasm::HeapType,_wasm::HeapType::BasicHeapType,_nullptr>
              ((EqHelper *)local_158,"bodyContents.getType().getHeapType()","HeapType::struct_",
               &local_160,&local_16c);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
    if (!bVar1) {
      testing::Message::Message(&local_178);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_158);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/possible-contents.cpp"
                 ,0x399,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_178);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
      testing::Message::~Message(&local_178);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
    CVar4 = ::wasm::PossibleContents::getCone((PossibleContents *)local_b8);
    local_1b0 = (uintptr_t)CVar4.type.id;
    local_1a8 = CVar4.depth;
    local_1b4 = 1;
    local_1a0 = local_1b0;
    local_198[0] = local_1a8;
    testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
              ((EqHelper *)local_190,"bodyContents.getCone().depth","Index(1)",local_198,&local_1b4)
    ;
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_190);
    if (!bVar1) {
      testing::Message::Message(&local_1c0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_190);
      testing::internal::AssertHelper::AssertHelper
                (&local_1c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/possible-contents.cpp"
                 ,0x39a,pcVar3);
      testing::internal::AssertHelper::operator=(&local_1c8,&local_1c0);
      testing::internal::AssertHelper::~AssertHelper(&local_1c8);
      testing::Message::~Message(&local_1c0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_190);
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_4_ = 0;
  }
  ::wasm::PossibleContents::~PossibleContents((PossibleContents *)local_b8);
  ::wasm::ContentOracle::~ContentOracle
            ((ContentOracle *)
             ((long)&bodyContents.value.
                     super__Variant_base<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     .
                     super__Move_assign_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     .
                     super__Copy_assign_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     .
                     super__Move_ctor_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                     .
                     super__Copy_ctor_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
             + 0x18));
  std::unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_>::~unique_ptr
            ((unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_> *)local_18);
  return;
}

Assistant:

TEST_F(PossibleContentsTest, TestOracleManyTypes) {
  // Test for a node with many possible types. The pass limits how many it
  // notices to not use excessive memory, so even though 4 are possible here,
  // we'll just report that more than one is possible, a cone of data.
  auto wasm = parse(R"(
    (module
      (type $A (sub (struct (field i32))))
      (type $B (sub (struct (field i64))))
      (type $C (sub (struct (field f32))))
      (type $D (sub (struct (field f64))))
      (func $foo (result (ref any))
        (select (result (ref any))
          (select (result (ref any))
            (struct.new_default $A)
            (struct.new_default $B)
            (i32.const 0)
          )
          (select (result (ref any))
            (struct.new_default $C)
            (struct.new_default $D)
            (i32.const 0)
          )
          (i32.const 0)
        )
      )
    )
  )");
  ContentOracle oracle(*wasm, options);
  // The body's contents must be a cone of data with depth 1.
  auto bodyContents =
    oracle.getContents(ResultLocation{wasm->getFunction("foo"), 0});
  ASSERT_TRUE(bodyContents.isConeType());
  EXPECT_EQ(bodyContents.getType().getHeapType(), HeapType::struct_);
  EXPECT_EQ(bodyContents.getCone().depth, Index(1));
}